

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O0

void gflags::anon_unknown_5::Test_FlagFileTest_FilenamesOurfileInBigList::Run(void)

{
  FlagSaver local_10;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","FlagFileTest","FilenamesOurfileInBigList");
  RunTest();
  FlagSaver::~FlagSaver(&local_10);
  return;
}

Assistant:

TEST(FlagFileTest, FilenamesOurfileInBigList) {
  FLAGS_test_string = "initial";
  FLAGS_test_bool = false;
  FLAGS_test_int32 = -1;
  FLAGS_test_double = -1.0;
  TestFlagString(
      // Flag string
      "-test_string=continued\n"
      "# some comments are in order\n"
      "# some\n"
      "  # comments\n"
      "#are\n"
      "                  #trickier\n"
      "# than others\n"
      "*first* *flags* *third*\n"
      "-test_bool=true\n"
      "     -test_int32=1\n"
      "flags\n"
      "-test_double=1000.0\n",
      // Expected values
      "continued",
      true,
      1,
      -1.0);
}